

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O0

void Gia_ManPrintSignals(Gia_Man_t *p,int *pFreq,char *pStr)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  uint local_34;
  uint local_30;
  int nTotal;
  int Counter;
  int i;
  Vec_Int_t *vObjs;
  char *pStr_local;
  int *pFreq_local;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  local_34 = 0;
  p_00 = Vec_IntAlloc(100);
  nTotal = 0;
  while( true ) {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= nTotal) break;
    if (1 < pFreq[nTotal]) {
      local_34 = pFreq[nTotal] + local_34;
      local_30 = local_30 + 1;
    }
    nTotal = nTotal + 1;
  }
  printf("%s (total = %d  driven = %d)\n",pStr,(ulong)local_30,(ulong)local_34);
  local_30 = 0;
  nTotal = 0;
  while( true ) {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= nTotal) break;
    if (10 < pFreq[nTotal]) {
      local_30 = local_30 + 1;
      pObj = Gia_ManObj(p,nTotal);
      uVar2 = Gia_ObjRefNum(p,pObj);
      printf("%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n",(ulong)local_30,(ulong)(uint)nTotal,
             (ulong)uVar2,(ulong)(uint)pFreq[nTotal]);
      Vec_IntPush(p_00,nTotal);
    }
    nTotal = nTotal + 1;
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManPrintSignals( Gia_Man_t * p, int * pFreq, char * pStr )
{
    Vec_Int_t * vObjs;
    int i, Counter = 0, nTotal = 0;
    vObjs = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 1 )
        {
            nTotal += pFreq[i];
            Counter++;
        }
    printf( "%s (total = %d  driven = %d)\n", pStr, Counter, nTotal );
    Counter = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 10 )
        {
            printf( "%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n", 
                ++Counter, i, Gia_ObjRefNum(p, Gia_ManObj(p,i)), pFreq[i] );
            Vec_IntPush( vObjs, i );
        }
    Vec_IntFree( vObjs );
}